

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

void lys_node_unlink(lys_node *node)

{
  lys_node *plVar1;
  lys_node *plVar2;
  LY_STMT stmt;
  lys_module *plVar3;
  lys_node *plVar4;
  lys_node **pplVar5;
  lys_node **pplVar6;
  lys_node *ext;
  
  if (node == (lys_node *)0x0) {
    return;
  }
  plVar3 = node->module;
  if (plVar3 != (lys_module *)0x0) {
    if ((plVar3->field_0x40 & 1) != 0) {
      plVar3 = (lys_module *)plVar3->data;
    }
    if (plVar3->data == node) {
      plVar3->data = node->next;
    }
  }
  ext = node->parent;
  if (ext == (lys_node *)0x0) {
LAB_0015d195:
    ext = (lys_node *)0x0;
  }
  else if (ext->nodetype == LYS_AUGMENT) {
    if (ext->child == node) {
      plVar1 = node->next;
      plVar4 = (lys_node *)0x0;
      if ((plVar1 != (lys_node *)0x0) && (plVar1->parent == ext)) {
        plVar4 = plVar1;
      }
      ext->child = plVar4;
    }
    if ((ext->flags & 1) != 0) goto LAB_0015d195;
    ext = ext->prev;
  }
  if (ext == (lys_node *)0x0) {
    pplVar6 = (lys_node **)0x0;
    goto LAB_0015d1e4;
  }
  if (ext->nodetype == LYS_EXT) {
    stmt = lys_snode2stmt(node->nodetype);
    pplVar5 = (lys_node **)
              lys_ext_complex_get_substmt
                        (stmt,(lys_ext_instance_complex *)ext,(lyext_substmt **)0x0);
    pplVar6 = pplVar5;
    if (*pplVar5 == node) {
LAB_0015d1d5:
      *pplVar5 = node->next;
    }
  }
  else {
    pplVar6 = (lys_node **)0x0;
    if (ext->child == node) {
      pplVar5 = &ext->child;
      goto LAB_0015d1d5;
    }
  }
  node->parent = (lys_node *)0x0;
LAB_0015d1e4:
  if (node->prev != node) {
    plVar1 = node->next;
    plVar4 = plVar1;
    if (plVar1 == (lys_node *)0x0) {
      plVar2 = node;
      if (ext == (lys_node *)0x0) {
        do {
          plVar4 = plVar2;
          plVar2 = plVar4->prev;
        } while (plVar4->prev->next != (lys_node *)0x0);
      }
      else {
        pplVar5 = &ext->child;
        if (ext->nodetype == LYS_EXT) {
          pplVar5 = pplVar6;
        }
        plVar4 = *pplVar5;
      }
    }
    plVar4->prev = node->prev;
    if (node->prev->next != (lys_node *)0x0) {
      node->prev->next = plVar1;
    }
    node->next = (lys_node *)0x0;
    node->prev = node;
  }
  return;
}

Assistant:

void
lys_node_unlink(struct lys_node *node)
{
    struct lys_node *parent, *first, **pp = NULL;
    struct lys_module *main_module;

    if (!node) {
        return;
    }

    /* unlink from data model if necessary */
    if (node->module) {
        /* get main module with data tree */
        main_module = lys_node_module(node);
        if (main_module->data == node) {
            main_module->data = node->next;
        }
    }

    /* store pointers to important nodes */
    parent = node->parent;
    if (parent && (parent->nodetype == LYS_AUGMENT)) {
        /* handle augments - first, unlink it from the augment parent ... */
        if (parent->child == node) {
            parent->child = (node->next && node->next->parent == parent) ? node->next : NULL;
        }

        if (parent->flags & LYS_NOTAPPLIED) {
            /* data are not connected in the target, so we cannot continue with the target as a parent */
            parent = NULL;
        } else {
            /* data are connected in target, so we will continue with the target as a parent */
            parent = ((struct lys_node_augment *)parent)->target;
        }
    }

    /* unlink from parent */
    if (parent) {
        if (parent->nodetype == LYS_EXT) {
            pp = (struct lys_node **)lys_ext_complex_get_substmt(lys_snode2stmt(node->nodetype),
                                                                 (struct lys_ext_instance_complex*)parent, NULL);
            if (*pp == node) {
                *pp = node->next;
            }
        } else if (parent->child == node) {
            parent->child = node->next;
        }
        node->parent = NULL;
    }

    /* unlink from siblings */
    if (node->prev == node) {
        /* there are no more siblings */
        return;
    }
    if (node->next) {
        node->next->prev = node->prev;
    } else {
        /* unlinking the last element */
        if (parent) {
            if (parent->nodetype == LYS_EXT) {
                first = *(struct lys_node **)pp;
            } else {
                first = parent->child;
            }
        } else {
            first = node;
            while (first->prev->next) {
                first = first->prev;
            }
        }
        first->prev = node->prev;
    }
    if (node->prev->next) {
        node->prev->next = node->next;
    }

    /* clean up the unlinked element */
    node->next = NULL;
    node->prev = node;
}